

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O0

void __thiscall serial::IOException::IOException(IOException *this,string *file,int line,int errnum)

{
  ostream *poVar1;
  string local_1e0 [32];
  char *local_1c0;
  char *error_str;
  stringstream ss;
  ostream local_1a8 [392];
  int local_20;
  int local_1c;
  int errnum_local;
  int line_local;
  string *file_local;
  IOException *this_local;
  
  local_20 = errnum;
  local_1c = line;
  _errnum_local = file;
  file_local = (string *)this;
  SerialException::SerialException(&this->super_SerialException);
  *(undefined ***)&this->super_SerialException = &PTR__IOException_0011fd50;
  std::__cxx11::string::string((string *)&this->file_,(string *)file);
  this->line_ = local_1c;
  std::__cxx11::string::string((string *)&this->e_what_);
  this->errno_ = local_20;
  std::__cxx11::stringstream::stringstream((stringstream *)&error_str);
  local_1c0 = strerror(local_20);
  poVar1 = std::operator<<(local_1a8,"IO Exception (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->errno_);
  poVar1 = std::operator<<(poVar1,"): ");
  std::operator<<(poVar1,local_1c0);
  poVar1 = std::operator<<(local_1a8,", file ");
  poVar1 = std::operator<<(poVar1,(string *)&this->file_);
  poVar1 = std::operator<<(poVar1,", line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->line_);
  std::operator<<(poVar1,".");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&error_str);
  return;
}

Assistant:

explicit IOException (std::string file, int line, int errnum)
    : file_(file), line_(line), errno_(errnum) {
      std::stringstream ss;
#if defined(_WIN32) && !defined(__MINGW32__)
      char error_str [1024];
      strerror_s(error_str, 1024, errnum);
#else
      char * error_str = strerror(errnum);
#endif
      ss << "IO Exception (" << errno_ << "): " << error_str;
      ss << ", file " << file_ << ", line " << line_ << ".";
      e_what_ = ss.str();
  }